

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cc
# Opt level: O3

bool libwebm::GetFileContents(string *file_name,string *contents)

{
  int iVar1;
  uint uVar2;
  __off_t _Var3;
  ifstream file;
  undefined1 *local_2d0 [2];
  undefined1 local_2c0 [16];
  long local_2b0 [4];
  uint auStack_290 [122];
  stat local_a8;
  
  std::ifstream::ifstream(local_2b0,(file_name->_M_dataplus)._M_p,_S_in);
  local_a8.st_size = 0;
  iVar1 = stat((file_name->_M_dataplus)._M_p,&local_a8);
  _Var3 = 0;
  if (iVar1 == 0) {
    _Var3 = local_a8.st_size;
  }
  local_2d0[0] = local_2c0;
  std::__cxx11::string::_M_construct((ulong)local_2d0,(char)_Var3);
  std::__cxx11::string::operator=((string *)contents,(string *)local_2d0);
  if (local_2d0[0] != local_2c0) {
    operator_delete(local_2d0[0]);
  }
  uVar2 = *(uint *)((long)auStack_290 + *(long *)(local_2b0[0] + -0x18));
  if (uVar2 == 0) {
    if (contents->_M_string_length == 0) {
      uVar2 = 0;
    }
    else {
      std::istream::read((char *)local_2b0,(long)(contents->_M_dataplus)._M_p);
      uVar2 = *(uint *)((long)auStack_290 + *(long *)(local_2b0[0] + -0x18));
    }
  }
  std::ifstream::~ifstream(local_2b0);
  return (uVar2 & 5) == 0;
}

Assistant:

bool GetFileContents(const std::string& file_name, std::string* contents) {
  std::ifstream file(file_name.c_str());
  *contents = std::string(static_cast<size_t>(GetFileSize(file_name)), 0);
  if (file.good() && contents->size()) {
    file.read(&(*contents)[0], contents->size());
  }
  return !file.fail();
}